

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

UBool uhash_equals_63(UHashtable *hash1,UHashtable *hash2)

{
  UHashTok key;
  void *pvVar1;
  UHashtable *hash;
  char cVar2;
  int32_t hashcode;
  UHashElement *pUVar3;
  UHashTok val2;
  UHashElement *elem2;
  UHashTok val1;
  UHashTok key1;
  UHashElement *elem1;
  int32_t i;
  int32_t pos;
  int32_t count2;
  int32_t count1;
  UHashtable *hash2_local;
  UHashtable *hash1_local;
  
  if (hash1 == hash2) {
    hash1_local._7_1_ = '\x01';
  }
  else if ((((hash1 == (UHashtable *)0x0) || (hash2 == (UHashtable *)0x0)) ||
           (hash1->keyComparator != hash2->keyComparator)) ||
          ((hash1->valueComparator != hash2->valueComparator ||
           (hash1->valueComparator == (undefined1 *)0x0)))) {
    hash1_local._7_1_ = '\0';
  }
  else {
    _count2 = hash2;
    hash2_local = hash1;
    pos = uhash_count_63(hash1);
    i = uhash_count_63(_count2);
    if (pos == i) {
      elem1._4_4_ = 0xffffffff;
      for (elem1._0_4_ = 0; (int)elem1 < pos; elem1._0_4_ = (int)elem1 + 1) {
        pUVar3 = uhash_nextElement_63(hash2_local,(int32_t *)((long)&elem1 + 4));
        hash = _count2;
        key = pUVar3->key;
        pvVar1 = (pUVar3->value).pointer;
        hashcode = (*_count2->keyHasher)(key);
        pUVar3 = _uhash_find(hash,key,hashcode);
        cVar2 = (*(code *)hash2_local->valueComparator)(pvVar1,(pUVar3->value).pointer);
        if (cVar2 == '\0') {
          return '\0';
        }
      }
      hash1_local._7_1_ = '\x01';
    }
    else {
      hash1_local._7_1_ = '\0';
    }
  }
  return hash1_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_equals(const UHashtable* hash1, const UHashtable* hash2){
    int32_t count1, count2, pos, i;

    if(hash1==hash2){
        return TRUE;
    }

    /*
     * Make sure that we are comparing 2 valid hashes of the same type
     * with valid comparison functions.
     * Without valid comparison functions, a binary comparison
     * of the hash values will yield random results on machines
     * with 64-bit pointers and 32-bit integer hashes.
     * A valueComparator is normally optional.
     */
    if (hash1==NULL || hash2==NULL ||
        hash1->keyComparator != hash2->keyComparator ||
        hash1->valueComparator != hash2->valueComparator ||
        hash1->valueComparator == NULL)
    {
        /*
        Normally we would return an error here about incompatible hash tables,
        but we return FALSE instead.
        */
        return FALSE;
    }

    count1 = uhash_count(hash1);
    count2 = uhash_count(hash2);
    if(count1!=count2){
        return FALSE;
    }

    pos=UHASH_FIRST;
    for(i=0; i<count1; i++){
        const UHashElement* elem1 = uhash_nextElement(hash1, &pos);
        const UHashTok key1 = elem1->key;
        const UHashTok val1 = elem1->value;
        /* here the keys are not compared, instead the key form hash1 is used to fetch
         * value from hash2. If the hashes are equal then then both hashes should
         * contain equal values for the same key!
         */
        const UHashElement* elem2 = _uhash_find(hash2, key1, hash2->keyHasher(key1));
        const UHashTok val2 = elem2->value;
        if(hash1->valueComparator(val1, val2)==FALSE){
            return FALSE;
        }
    }
    return TRUE;
}